

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deFilePath.cpp
# Opt level: O3

bool __thiscall de::FilePath::beginsWithDrive(FilePath *this)

{
  char cVar1;
  pointer pcVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  byte bVar7;
  
  uVar4 = (uint)(this->m_path)._M_string_length;
  if ((int)uVar4 < 1) {
    bVar3 = false;
  }
  else {
    pcVar2 = (this->m_path)._M_dataplus._M_p;
    uVar5 = (ulong)(uVar4 & 0x7fffffff);
    bVar3 = true;
    uVar6 = 0;
    do {
      cVar1 = pcVar2[uVar6];
      if (cVar1 == ':') {
        if ((long)(uVar6 + 1) < (long)uVar5) {
          cVar1 = pcVar2[uVar6 + 1];
          this = (FilePath *)&DAT_00000001;
          bVar7 = 1;
          if (cVar1 != '/') goto joined_r0x00ac986f;
          break;
        }
      }
      else {
        this = (FilePath *)0x0;
        bVar7 = 0;
        if (cVar1 == '/') break;
joined_r0x00ac986f:
        if (cVar1 == '\\') break;
      }
      bVar7 = (byte)this;
      uVar6 = uVar6 + 1;
      bVar3 = (long)uVar6 < (long)uVar5;
    } while (uVar6 != uVar5);
    bVar3 = (bool)(bVar3 & bVar7);
  }
  return bVar3;
}

Assistant:

bool FilePath::beginsWithDrive (void) const
{
	for (int ndx = 0; ndx < (int)m_path.length(); ndx++)
	{
		if (m_path[ndx] == ':' && ndx+1 < (int)m_path.length() && isSeparator(m_path[ndx+1]))
			return true; // First part is drive letter.
		if (isSeparator(m_path[ndx]))
			return false;
	}
	return false;
}